

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.hpp
# Opt level: O2

void __thiscall
peach::expression::AssignExpression::AssignExpression
          (AssignExpression *this,ExprShPtr *left,ExprShPtr *right,FunctionType *functor)

{
  invalid_argument *this_00;
  __shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->super_SingleIndentationLevelExpression).super_Expression._vptr_Expression =
       (_func_int **)&PTR_eval_00141a00;
  (this->left_).super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->left_).super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right_).super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->right_).super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::function<void_(int_&,_int)>::function(&this->functor_,functor);
  if (((left->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
       != (element_type *)0x0) &&
     ((right->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      != (element_type *)0x0)) {
    std::dynamic_pointer_cast<peach::expression::LvalueExpression,peach::expression::Expression>
              ((shared_ptr<peach::expression::Expression> *)&local_40);
    std::__shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->left_).
                super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if ((this->left_).
        super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      exception::throwFromCoords<peach::exception::InvalidAssignationError>(0,0);
    }
    std::__shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->right_).
                super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>,
               &right->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>
              );
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"nullptr expression in AssignExpression constructor");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

AssignExpression(
        ExprShPtr left,
        ExprShPtr right,
        FunctionType functor)
        : functor_(std::move(functor))
    {
        if (!left || !right)
        {
            throw std::invalid_argument("nullptr expression in AssignExpression constructor");
        }
        left_ = std::dynamic_pointer_cast<LvalueExpression>(left);
        if (!left_)
        {
            exception::throwFromCoords<exception::InvalidAssignationError>(0, 0); // TODO: expression must know its position
        }
        right_ = std::move(right);
    }